

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<pbrt::Bounds2<int>&,pbrt::Bounds2<int>&>
               (char *fmt,Bounds2<int> *args,Bounds2<int> *args_1)

{
  char *in_stack_ffffffffffffffa8;
  FileLoc *loc;
  Bounds2<int> *in_stack_ffffffffffffffc8;
  Bounds2<int> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  loc = (FileLoc *)&stack0xffffffffffffffc8;
  StringPrintf<pbrt::Bounds2<int>&,pbrt::Bounds2<int>&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::c_str();
  ErrorExit(loc,in_stack_ffffffffffffffa8);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}